

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 FormatConsumer(void *pSrc,uint nLen,void *pData)

{
  undefined4 local_2c;
  sxi32 rc;
  SyFmtConsumer *pConsumer;
  void *pData_local;
  uint nLen_local;
  void *pSrc_local;
  
  local_2c = -10;
  if (*(int *)((long)pData + 4) == 1) {
    local_2c = (**(code **)((long)pData + 0x10))(pSrc,nLen,*(undefined8 *)((long)pData + 0x18));
  }
  else if (*(int *)((long)pData + 4) == 6) {
    local_2c = SyBlobAppend(*(SyBlob **)((long)pData + 0x10),pSrc,nLen);
  }
  *(uint *)pData = nLen + *pData;
  *(sxi32 *)((long)pData + 8) = local_2c;
  return local_2c;
}

Assistant:

static sxi32 FormatConsumer(const void *pSrc, unsigned int nLen, void *pData)
{
	SyFmtConsumer *pConsumer = (SyFmtConsumer *)pData;
	sxi32 rc = SXERR_ABORT;
	switch(pConsumer->nType){
	case SXFMT_CONS_PROC:
			/* User callback */
			rc = pConsumer->uConsumer.sFunc.xUserConsumer(pSrc, nLen, pConsumer->uConsumer.sFunc.pUserData);
			break;
	case SXFMT_CONS_BLOB:
			/* Blob consumer */
			rc = SyBlobAppend(pConsumer->uConsumer.pBlob, pSrc, (sxu32)nLen);
			break;
		default: 
			/* Unknown consumer */
			break;
	}
	/* Update total number of bytes consumed so far */
	pConsumer->nLen += nLen;
	pConsumer->rc = rc;
	return rc;	
}